

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

pairNf * __thiscall
pbrt::syntactic::ParamSet::getParamPairNf(ParamSet *this,string *name,pairNf *fallBack)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  runtime_error *this_00;
  element_type *peVar4;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference this_01;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *in_RDI;
  size_t i;
  size_t N;
  shared_ptr<pbrt::syntactic::ParamArray<float>_> p;
  shared_ptr<pbrt::syntactic::Param> pr;
  const_iterator it;
  pairNf *res;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *in_stack_fffffffffffffe78;
  shared_ptr<pbrt::syntactic::Param> *in_stack_fffffffffffffe80;
  ParamArray<float> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined1 in_stack_fffffffffffffe88 [16];
  allocator_type *__a;
  shared_ptr<pbrt::syntactic::Param> *in_stack_fffffffffffffe98;
  ulong uVar6;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
  *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
  *in_stack_fffffffffffffec8;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
  *in_stack_fffffffffffffed0;
  pair<float,_float> local_108;
  ulong local_100;
  undefined1 local_f1;
  ulong local_f0;
  undefined1 local_e1;
  string local_c0 [35];
  undefined1 local_9d;
  string local_70 [32];
  ParamArray<float> local_50;
  char *__lhs;
  
  local_50.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                ::find(in_stack_fffffffffffffe78,(key_type *)0x15e49e);
  local_50.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                ::end(in_stack_fffffffffffffe78);
  bVar1 = std::operator==((_Self *)&local_50.super_vector<float,_std::allocator<float>_>.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,
                          (_Self *)&local_50.super_vector<float,_std::allocator<float>_>.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_finish);
  if (bVar1) {
    std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::vector
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)0x15e4f7);
    std::shared_ptr<pbrt::syntactic::Param>::shared_ptr
              (in_stack_fffffffffffffe80,
               (shared_ptr<pbrt::syntactic::Param> *)in_stack_fffffffffffffe78);
    std::dynamic_pointer_cast<pbrt::syntactic::ParamArray<float>,pbrt::syntactic::Param>
              (in_stack_fffffffffffffe98);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_50);
    pbVar5 = in_stack_fffffffffffffe88._0_8_;
    if (!bVar1) {
      local_9d = 1;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      std::operator+(pbVar5,(char *)in_stack_fffffffffffffe80);
      std::runtime_error::runtime_error(this_00,local_70);
      local_9d = 0;
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar4 = std::
             __shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x15e643);
    uVar2 = (*(peVar4->super_Param)._vptr_Param[1])();
    __a = in_stack_fffffffffffffe88._8_8_;
    pbVar5 = in_stack_fffffffffffffe88._0_8_;
    __lhs = (char *)CONCAT44(extraout_var,uVar2);
    if ((uVar2 & 1) != 0) {
      local_e1 = 1;
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::operator+(__lhs,__rhs);
      std::operator+(pbVar5,(char *)in_stack_fffffffffffffe80);
      std::runtime_error::runtime_error((runtime_error *)__rhs,local_c0);
      local_e1 = 0;
      __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar4 = std::
             __shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x15e790);
    iVar3 = (*(peVar4->super_Param)._vptr_Param[1])();
    local_f0 = CONCAT44(extraout_var_00,iVar3) >> 1;
    local_f1 = 0;
    std::allocator<std::pair<float,_float>_>::allocator
              ((allocator<std::pair<float,_float>_> *)0x15e7da);
    std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::vector
              (in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98,__a);
    std::allocator<std::pair<float,_float>_>::~allocator
              ((allocator<std::pair<float,_float>_> *)0x15e7fd);
    local_100 = 0;
    while( true ) {
      uVar6 = local_100;
      peVar4 = std::
               __shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x15e823);
      iVar3 = (*(peVar4->super_Param)._vptr_Param[1])();
      if (CONCAT44(extraout_var_01,iVar3) <= uVar6) break;
      this_02 = &local_50;
      std::
      __shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x15e85b);
      ParamArray<float>::get(this_02,(size_t)in_stack_fffffffffffffe78);
      std::
      __shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x15e87b);
      ParamArray<float>::get(this_02,(size_t)in_stack_fffffffffffffe78);
      local_108 = std::make_pair<float,float>((float *)in_stack_fffffffffffffe78,(float *)0x15e8a3);
      this_01 = std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                operator[](in_RDI,local_100 >> 1);
      std::pair<float,_float>::operator=(this_01,&local_108);
      local_100 = local_100 + 2;
    }
    local_f1 = 1;
    std::shared_ptr<pbrt::syntactic::ParamArray<float>_>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::ParamArray<float>_> *)0x15e962);
    std::shared_ptr<pbrt::syntactic::Param>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Param> *)0x15e96f);
  }
  return in_RDI;
}

Assistant:

pairNf ParamSet::getParamPairNf(const std::string &name, const pairNf &fallBack) const
    {
      std::map<std::string,std::shared_ptr<Param> >::const_iterator it=param.find(name);
      if (it == param.end())
        return fallBack;
      std::shared_ptr<Param> pr = it->second;
      const std::shared_ptr<ParamArray<float>> p = std::dynamic_pointer_cast<ParamArray<float>>(pr);
      if (!p)
        throw std::runtime_error("3f: found param of given name, but of wrong type! (name was '"+name+"'");
      if (p->getSize() % 2 != 0)
        throw std::runtime_error("found param of given name and type, but components aren't pairs! (PairNf, name='"+name+"'");
      std::size_t N = p->getSize()/2;
      pairNf res(N);
      for (std::size_t i=0; i<p->getSize(); i+=2)
      {
        res[i/2] = std::make_pair(p->get(i), p->get(i+1));
      }
      return res;
    }